

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AssignEvaluator.h
# Opt level: O0

void Eigen::internal::unaligned_dense_assignment_loop<false>::
     run<Eigen::internal::generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Matrix<float,_1,1,0,_1,1>>,Eigen::internal::evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_sqrt_op<float>,Eigen::ArrayWrapper<Eigen::Matrix<float,_1,1,0,_1,1>const>const>>,Eigen::internal::assign_op<float,float>,0>>
               (generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Matrix<float,__1,_1,_0,__1,_1>_>,_Eigen::internal::evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_sqrt_op<float>,_const_Eigen::ArrayWrapper<const_Eigen::Matrix<float,__1,_1,_0,__1,_1>_>_>_>,_Eigen::internal::assign_op<float,_float>,_0>
                *kernel,Index start,Index end)

{
  undefined8 local_28;
  Index index;
  Index end_local;
  Index start_local;
  generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Matrix<float,__1,_1,_0,__1,_1>_>,_Eigen::internal::evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_sqrt_op<float>,_const_Eigen::ArrayWrapper<const_Eigen::Matrix<float,__1,_1,_0,__1,_1>_>_>_>,_Eigen::internal::assign_op<float,_float>,_0>
  *kernel_local;
  
  for (local_28 = start; local_28 < end; local_28 = local_28 + 1) {
    generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Matrix<float,_-1,_1,_0,_-1,_1>_>,_Eigen::internal::evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_sqrt_op<float>,_const_Eigen::ArrayWrapper<const_Eigen::Matrix<float,_-1,_1,_0,_-1,_1>_>_>_>,_Eigen::internal::assign_op<float,_float>,_0>
    ::assignCoeff(kernel,local_28);
  }
  return;
}

Assistant:

EIGEN_DEVICE_FUNC static EIGEN_STRONG_INLINE void run(Kernel &kernel,
                                      Index start,
                                      Index end)
#endif
  {
    for (Index index = start; index < end; ++index)
      kernel.assignCoeff(index);
  }